

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_110eb68::HandleGlobImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool recurse,cmExecutionStatus *status)

{
  WorkingMode WVar1;
  uint uVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  long lVar5;
  pointer pMVar6;
  bool bVar7;
  PolicyStatus PVar8;
  int iVar9;
  undefined4 uVar10;
  long *plVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  undefined8 extraout_RAX;
  char *pcVar12;
  char *__s;
  ulong uVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  bool bVar15;
  byte bVar16;
  size_type *psVar18;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID extraout_EDX_02;
  PolicyID extraout_EDX_03;
  PolicyID extraout_EDX_04;
  PolicyID extraout_EDX_05;
  PolicyID extraout_EDX_06;
  PolicyID id;
  char *extraout_RDX;
  undefined7 in_register_00000031;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  byte bVar21;
  pointer pMVar22;
  pointer pbVar23;
  pointer pbVar24;
  pointer pbVar25;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view separator;
  string_view value_00;
  string_view value_01;
  undefined1 auVar26 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined8 local_190;
  char *local_188;
  size_type local_180;
  pointer local_178;
  uint local_16c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_168;
  string local_160;
  undefined4 local_140;
  undefined4 local_13c;
  uint local_138;
  undefined4 local_134;
  cmake *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string expr;
  string variable;
  GlobMessages globMessages;
  Glob g;
  ulong uVar17;
  
  pbVar25 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_168 = args;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar25) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileCommand.cxx"
                  ,0x26f,
                  "bool (anonymous namespace)::HandleGlobImpl(const std::vector<std::string> &, bool, cmExecutionStatus &)"
                 );
  }
  uVar13 = CONCAT71(in_register_00000031,recurse) & 0xffffffff;
  variable._M_dataplus._M_p = (pointer)&variable.field_2;
  pcVar3 = pbVar25[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&variable,pcVar3,pcVar3 + pbVar25[1]._M_string_length);
  cmsys::Glob::Glob(&g);
  bVar21 = (byte)uVar13;
  g.Recurse = (bool)bVar21;
  PVar8 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0009,false);
  if ((PVar8 < (REQUIRED_ALWAYS|WARN) & bVar21) != 0) {
    g.RecurseThroughSymlinks = SUB81(0x101L >> ((char)PVar8 * '\b' & 0x3fU),0);
  }
  local_130 = cmMakefile::GetCMakeInstance(status->Makefile);
  pbVar25 = pbVar25 + 2;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pbVar25 !=
      (local_168->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    WVar1 = local_130->CurrentWorkingMode;
    local_16c = (uint)CONCAT71(in_register_00000031,recurse);
    local_134 = 0;
    local_138 = 0;
    local_13c = 0;
    local_140 = 0;
    do {
      iVar9 = std::__cxx11::string::compare((char *)pbVar25);
      if (iVar9 == 0) {
        if (pbVar25 + 1 ==
            (local_168->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"LIST_DIRECTORIES missing bool value.","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00360428;
        }
        value._M_str = extraout_RDX;
        value._M_len = (size_t)pbVar25[1]._M_dataplus._M_p;
        bVar7 = cmValue::IsOn((cmValue *)pbVar25[1]._M_string_length,value);
        bVar15 = true;
        id = extraout_EDX_00;
        if (!bVar7) {
          value_01._M_str = pbVar25[1]._M_dataplus._M_p;
          value_01._M_len = pbVar25[1]._M_string_length;
          bVar7 = cmValue::IsOff(value_01);
          if (!bVar7) {
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1b0,"LIST_DIRECTORIES missing bool value.","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00360428;
          }
          bVar15 = false;
          id = extraout_EDX_01;
        }
        pbVar25 = pbVar25 + 2;
        g.ListDirs = bVar15;
        g.RecurseListDirs = bVar15;
      }
      else {
        auVar26 = std::__cxx11::string::compare((char *)pbVar25);
        id = auVar26._8_4_;
        if (auVar26._0_4_ != 0) {
          iVar9 = std::__cxx11::string::compare((char *)pbVar25);
          if (iVar9 == 0) {
            if (pbVar25 + 1 ==
                (local_168->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1b0,"GLOB requires a directory after the RELATIVE tag.",""
                        );
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            else {
              cmsys::Glob::SetRelative(&g,pbVar25[1]._M_dataplus._M_p);
              pbVar25 = pbVar25 + 2;
              id = extraout_EDX_02;
              if (pbVar25 !=
                  (local_168->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00360169;
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1b0,"GLOB requires a glob expression after the directory."
                         ,"");
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
LAB_00360428:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)pbVar25);
            if (iVar9 == 0) {
              bVar16 = (byte)local_138 | ~(byte)local_13c;
              uVar17 = (ulong)CONCAT31((int3)(local_138 >> 8),bVar16);
              id = extraout_EDX;
              if ((bVar16 & 1) == 0) {
                pcVar4 = status->Makefile;
                local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1b0,
                           "CONFIGURE_DEPENDS flag was given after a glob expression was already evaluated."
                           ,"");
                cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,&local_1b0);
                id = extraout_EDX_03;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                  id = extraout_EDX_04;
                }
              }
              if (WVar1 == NORMAL_MODE) {
                pbVar25 = pbVar25 + 1;
                local_138 = (uint)CONCAT71((int7)(uVar17 >> 8),1);
                if (pbVar25 !=
                    (local_168->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00360169;
                local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1b0,
                           "GLOB requires a glob expression after CONFIGURE_DEPENDS.","");
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
              else {
                pcVar4 = status->Makefile;
                local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1b0,
                           "CONFIGURE_DEPENDS is invalid for script and find package modes.","");
                cmMakefile::IssueMessage(pcVar4,FATAL_ERROR,&local_1b0);
              }
              goto LAB_00360428;
            }
            expr._M_dataplus._M_p = (pointer)&expr.field_2;
            pcVar3 = (pbVar25->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&expr,pcVar3,pcVar3 + pbVar25->_M_string_length);
            bVar7 = cmsys::SystemTools::FileIsFullPath(pbVar25);
            if (!bVar7) {
              cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
              std::__cxx11::string::_M_assign((string *)&expr);
              if (expr._M_string_length == 0) {
                std::__cxx11::string::_M_assign((string *)&expr);
              }
              else {
                std::operator+(&local_1b0,"/",pbVar25);
                std::__cxx11::string::_M_append((char *)&expr,(ulong)local_1b0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                }
              }
            }
            globMessages.
            super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            globMessages.
            super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            globMessages.
            super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmsys::Glob::FindFiles(&g,&expr,&globMessages);
            pMVar6 = globMessages.
                     super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (globMessages.
                super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                globMessages.
                super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
LAB_0035ff78:
              uVar2 = local_16c;
              if (((bVar21 ^ 1 | (byte)local_134) & 1) == 0) {
                local_140 = CONCAT31((int3)((uint)local_140 >> 8),
                                     (byte)local_140 | g.FollowedSymlinkCount != 0);
              }
              this = cmsys::Glob::GetFiles_abi_cxx11_(&g);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&files
                         ,files.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                         (this->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (this->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
              uVar10 = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              if ((local_138 & 1) != 0) {
                pbVar24 = (this->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                pbVar23 = (this->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
                if (pbVar24 != pbVar23) {
                  uVar13 = (long)pbVar23 - (long)pbVar24 >> 5;
                  lVar5 = 0x3f;
                  if (uVar13 != 0) {
                    for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (pbVar24,pbVar23,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
                  std::
                  __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (pbVar24,pbVar23);
                  pbVar24 = (this->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  pbVar23 = (this->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                }
                _Var14 = std::
                         __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                                   (pbVar24,pbVar23);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase(this,(iterator)_Var14._M_current,
                           (this->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
                bVar15 = g.RecurseThroughSymlinks;
                bVar7 = (&g.ListDirs)[SUB41(uVar2,0)];
                pcVar12 = cmsys::Glob::GetRelative(&g);
                __s = "";
                if (pcVar12 != (char *)0x0) {
                  __s = cmsys::Glob::GetRelative(&g);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1b0,__s,(allocator<char> *)&local_108);
                cmMakefile::GetBacktrace(status->Makefile);
                cmake::AddGlobCacheEntry
                          (local_130,SUB41(uVar2,0),(bool)(bVar7 & 1),
                           (bool)(bVar15 & (byte)local_16c),&local_1b0,&expr,this,&variable,
                           (cmListFileBacktrace *)&local_160);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_160._M_string_length);
                }
                uVar2 = local_16c;
                uVar10 = local_13c;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                  uVar10 = local_13c;
                }
              }
              pbVar25 = pbVar25 + 1;
              bVar7 = true;
              local_13c = uVar10;
            }
            else {
              bVar7 = false;
              pMVar22 = globMessages.
                        super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                while (pMVar22->type == cyclicRecursion) {
                  pcVar4 = status->Makefile;
                  std::operator+(&local_108,"Cyclic recursion detected while globbing for \'",
                                 pbVar25);
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_108);
                  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
                  psVar18 = (size_type *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar18) {
                    local_160.field_2._M_allocated_capacity = *psVar18;
                    local_160.field_2._8_8_ = plVar11[3];
                  }
                  else {
                    local_160.field_2._M_allocated_capacity = *psVar18;
                    local_160._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_160._M_string_length = plVar11[1];
                  *plVar11 = (long)psVar18;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  plVar11 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&local_160,
                                               (ulong)(pMVar22->content)._M_dataplus._M_p);
                  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                  psVar18 = (size_type *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar18) {
                    local_1b0.field_2._M_allocated_capacity = *psVar18;
                    local_1b0.field_2._8_8_ = plVar11[3];
                  }
                  else {
                    local_1b0.field_2._M_allocated_capacity = *psVar18;
                    local_1b0._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_1b0._M_string_length = plVar11[1];
                  *plVar11 = (long)psVar18;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,&local_1b0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p,
                                    local_1b0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_160._M_dataplus._M_p != &local_160.field_2) {
                    operator_delete(local_160._M_dataplus._M_p,
                                    local_160.field_2._M_allocated_capacity + 1);
                  }
                  uVar19 = local_108.field_2._M_allocated_capacity;
                  _Var20._M_p = local_108._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_0035fdf7:
                    operator_delete(_Var20._M_p,uVar19 + 1);
                  }
LAB_0035fdff:
                  pMVar22 = pMVar22 + 1;
                  if (pMVar22 == pMVar6) {
                    if (!bVar7) goto LAB_0035ff78;
                    goto LAB_0035ff6e;
                  }
                }
                if (pMVar22->type != error) {
                  if ((local_130->DebugOutput != false) || (local_130->Trace == true)) {
                    pcVar4 = status->Makefile;
                    local_1b0.field_2._8_8_ = (pbVar25->_M_dataplus)._M_p;
                    local_1b0.field_2._M_allocated_capacity = pbVar25->_M_string_length;
                    local_1b0._M_dataplus._M_p = (pointer)0xf;
                    local_1b0._M_string_length = 0x772ab9;
                    local_190 = 0x18;
                    local_188 = "\nEncountered an error:\n ";
                    local_178 = (pMVar22->content)._M_dataplus._M_p;
                    local_180 = (pMVar22->content)._M_string_length;
                    views._M_len = 4;
                    views._M_array = (iterator)&local_1b0;
                    cmCatViews_abi_cxx11_(&local_160,views);
                    cmMakefile::IssueMessage(pcVar4,LOG,&local_160);
                    uVar19 = local_160.field_2._M_allocated_capacity;
                    _Var20._M_p = local_160._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p != &local_160.field_2) goto LAB_0035fdf7;
                  }
                  goto LAB_0035fdff;
                }
                pcVar4 = status->Makefile;
                std::operator+(&local_108,"Error has occurred while globbing for \'",pbVar25);
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_108);
                local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
                psVar18 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_160.field_2._M_allocated_capacity = *psVar18;
                  local_160.field_2._8_8_ = plVar11[3];
                }
                else {
                  local_160.field_2._M_allocated_capacity = *psVar18;
                  local_160._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_160._M_string_length = plVar11[1];
                *plVar11 = (long)psVar18;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_160,
                                             (ulong)(pMVar22->content)._M_dataplus._M_p);
                local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                psVar18 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_1b0.field_2._M_allocated_capacity = *psVar18;
                  local_1b0.field_2._8_8_ = plVar11[3];
                }
                else {
                  local_1b0.field_2._M_allocated_capacity = *psVar18;
                  local_1b0._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_1b0._M_string_length = plVar11[1];
                *plVar11 = (long)psVar18;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                cmMakefile::IssueMessage(pcVar4,FATAL_ERROR,&local_1b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160._M_dataplus._M_p != &local_160.field_2) {
                  operator_delete(local_160._M_dataplus._M_p,
                                  local_160.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                pMVar22 = pMVar22 + 1;
                bVar7 = true;
              } while (pMVar22 != pMVar6);
LAB_0035ff6e:
              bVar7 = false;
              uVar2 = local_16c;
            }
            uVar13 = (ulong)uVar2;
            std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector
                      (&globMessages);
            id = extraout_EDX_05;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)expr._M_dataplus._M_p != &expr.field_2) {
              operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
              id = extraout_EDX_06;
            }
            if (bVar7) goto LAB_00360169;
          }
          bVar7 = false;
          goto LAB_00360441;
        }
        pbVar25 = pbVar25 + 1;
        if ((char)uVar13 != '\0') {
          g.RecurseThroughSymlinks = true;
          local_134 = (undefined4)CONCAT71(auVar26._1_7_,1);
          if (pbVar25 ==
              (local_168->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1b0,
                       "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00360428;
          }
        }
      }
LAB_00360169:
    } while (pbVar25 !=
             (local_168->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    if ((PVar8 < NEW & (byte)local_140) == 1) {
      pcVar4 = status->Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1b0,(cmPolicies *)0x9,id);
      cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pbVar24 = files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar25 = files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar13 = (long)files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar5 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar25,pbVar24);
  }
  _Var14 = std::
           __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&files,(iterator)_Var14._M_current,
             (iterator)
             files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pcVar4 = status->Makefile;
  separator._M_str = ";";
  separator._M_len = 1;
  cmJoin(&local_1b0,&files,separator,(string_view)ZEXT816(0));
  value_00._M_str = local_1b0._M_dataplus._M_p;
  value_00._M_len = local_1b0._M_string_length;
  cmMakefile::AddDefinition(pcVar4,&variable,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  bVar7 = true;
LAB_00360441:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  cmsys::Glob::~Glob(&g);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)variable._M_dataplus._M_p != &variable.field_2) {
    operator_delete(variable._M_dataplus._M_p,variable.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool HandleGlobImpl(std::vector<std::string> const& args, bool recurse,
                    cmExecutionStatus& status)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  auto i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus policyStatus =
    status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0009);
  if (recurse) {
    switch (policyStatus) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::WARN:
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        g.RecurseThroughSymlinksOn();
        break;
    }
  }

  cmake* cm = status.GetMakefile().GetCMakeInstance();
  std::vector<std::string> files;
  bool configureDepends = false;
  bool warnConfigureLate = false;
  bool warnFollowedSymlinks = false;
  const cmake::WorkingMode workingMode = cm->GetWorkingMode();
  while (i != args.end()) {
    if (*i == "LIST_DIRECTORIES") {
      ++i; // skip LIST_DIRECTORIES
      if (i != args.end()) {
        if (cmIsOn(*i)) {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
        } else if (cmIsOff(*i)) {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
        } else {
          status.SetError("LIST_DIRECTORIES missing bool value.");
          return false;
        }
        ++i;
      } else {
        status.SetError("LIST_DIRECTORIES missing bool value.");
        return false;
      }
    } else if (*i == "FOLLOW_SYMLINKS") {
      ++i; // skip FOLLOW_SYMLINKS
      if (recurse) {
        explicitFollowSymlinks = true;
        g.RecurseThroughSymlinksOn();
        if (i == args.end()) {
          status.SetError(
            "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.");
          return false;
        }
      }
    } else if (*i == "RELATIVE") {
      ++i; // skip RELATIVE
      if (i == args.end()) {
        status.SetError("GLOB requires a directory after the RELATIVE tag.");
        return false;
      }
      g.SetRelative(i->c_str());
      ++i;
      if (i == args.end()) {
        status.SetError(
          "GLOB requires a glob expression after the directory.");
        return false;
      }
    } else if (*i == "CONFIGURE_DEPENDS") {
      // Generated build system depends on glob results
      if (!configureDepends && warnConfigureLate) {
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          "CONFIGURE_DEPENDS flag was given after a glob expression was "
          "already evaluated.");
      }
      if (workingMode != cmake::NORMAL_MODE) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          "CONFIGURE_DEPENDS is invalid for script and find package modes.");
        return false;
      }
      configureDepends = true;
      ++i;
      if (i == args.end()) {
        status.SetError(
          "GLOB requires a glob expression after CONFIGURE_DEPENDS.");
        return false;
      }
    } else {
      std::string expr = *i;
      if (!cmsys::SystemTools::FileIsFullPath(*i)) {
        expr = status.GetMakefile().GetCurrentSourceDirectory();
        // Handle script mode
        if (!expr.empty()) {
          expr += "/" + *i;
        } else {
          expr = *i;
        }
      }

      cmsys::Glob::GlobMessages globMessages;
      g.FindFiles(expr, &globMessages);

      if (!globMessages.empty()) {
        bool shouldExit = false;
        for (cmsys::Glob::Message const& globMessage : globMessages) {
          if (globMessage.type == cmsys::Glob::cyclicRecursion) {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              "Cyclic recursion detected while globbing for '" + *i + "':\n" +
                globMessage.content);
          } else if (globMessage.type == cmsys::Glob::error) {
            status.GetMakefile().IssueMessage(
              MessageType::FATAL_ERROR,
              "Error has occurred while globbing for '" + *i + "' - " +
                globMessage.content);
            shouldExit = true;
          } else if (cm->GetDebugOutput() || cm->GetTrace()) {
            status.GetMakefile().IssueMessage(
              MessageType::LOG,
              cmStrCat("Globbing for\n  ", *i, "\nEncountered an error:\n ",
                       globMessage.content));
          }
        }
        if (shouldExit) {
          return false;
        }
      }

      if (recurse && !explicitFollowSymlinks &&
          g.GetFollowedSymlinkCount() != 0) {
        warnFollowedSymlinks = true;
      }

      std::vector<std::string>& foundFiles = g.GetFiles();
      cm::append(files, foundFiles);

      if (configureDepends) {
        std::sort(foundFiles.begin(), foundFiles.end());
        foundFiles.erase(std::unique(foundFiles.begin(), foundFiles.end()),
                         foundFiles.end());
        cm->AddGlobCacheEntry(
          recurse, (recurse ? g.GetRecurseListDirs() : g.GetListDirs()),
          (recurse ? g.GetRecurseThroughSymlinks() : false),
          (g.GetRelative() ? g.GetRelative() : ""), expr, foundFiles, variable,
          status.GetMakefile().GetBacktrace());
      } else {
        warnConfigureLate = true;
      }
      ++i;
    }
  }

  switch (policyStatus) {
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Correct behavior, yay!
      break;
    case cmPolicies::OLD:
    // Probably not really the expected behavior, but the author explicitly
    // asked for the old behavior... no warning.
    case cmPolicies::WARN:
      // Possibly unexpected old behavior *and* we actually traversed
      // symlinks without being explicitly asked to: warn the author.
      if (warnFollowedSymlinks) {
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
      }
      break;
  }

  std::sort(files.begin(), files.end());
  files.erase(std::unique(files.begin(), files.end()), files.end());
  status.GetMakefile().AddDefinition(variable, cmJoin(files, ";"));
  return true;
}